

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

void __thiscall Input_Port::Destroy(Input_Port *this,Am_Constraint *self)

{
  bool bVar1;
  Am_Slot_Data *pAVar2;
  Am_Constraint_Tag dependency_tag;
  Am_Constraint_Tag tag;
  Am_Constraint *curr;
  Am_Dependency_Iterator iter;
  Am_Slot local_20;
  Am_Slot slot;
  Am_Constraint *self_local;
  Input_Port *this_local;
  
  local_20.data = (this->context).data;
  slot.data = (Am_Slot_Data *)self;
  Am_Slot::Am_Slot((Am_Slot *)&iter.current,(Am_Slot_Data *)0x0);
  (this->context).data = (Am_Slot_Data *)iter.current;
  if (this->next != (Input_Port *)0x0) {
    Destroy(this->next,(Am_Constraint *)slot.data);
    this->next = (Input_Port *)0x0;
  }
  Am_Dependency_Iterator::Am_Dependency_Iterator((Am_Dependency_Iterator *)&curr,&local_20);
  Am_Dependency_Iterator::Start((Am_Dependency_Iterator *)&curr);
  do {
    bVar1 = Am_Dependency_Iterator::Last((Am_Dependency_Iterator *)&curr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_00267a82:
      if (this != (Input_Port *)0x0) {
        ~Input_Port(this);
        operator_delete(this,0x48);
      }
      return;
    }
    pAVar2 = (Am_Slot_Data *)Am_Dependency_Iterator::Get((Am_Dependency_Iterator *)&curr);
    if (pAVar2 == slot.data) {
      dependency_tag = Am_Dependency_Iterator::Get_Tag((Am_Dependency_Iterator *)&curr);
      Am_Slot::Remove_Dependency(&local_20,dependency_tag);
      goto LAB_00267a82;
    }
    Am_Dependency_Iterator::Next((Am_Dependency_Iterator *)&curr);
  } while( true );
}

Assistant:

void Destroy(Am_Constraint *self)
  {
    Am_Slot slot = context;
    context = (Am_Slot_Data *)nullptr;
    if (next) {
      next->Destroy(self);
      next = nullptr;
    }
    Am_Dependency_Iterator iter(slot);
    Am_Constraint *curr;
    for (iter.Start(); !iter.Last(); iter.Next()) {
      curr = iter.Get();
      if (curr == self) {
        Am_Constraint_Tag tag = iter.Get_Tag();
        slot.Remove_Dependency(tag);
        break;
      }
    }
    delete this;
  }